

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

int __thiscall
Fl_Text_Display::count_lines(Fl_Text_Display *this,int startPos,int endPos,bool startPosIsLineStart)

{
  Fl_Text_Buffer *pFVar1;
  int local_3c;
  int local_38;
  int retLineEnd;
  int retLineStart;
  int retPos;
  int retLines;
  int iStack_24;
  bool startPosIsLineStart_local;
  int endPos_local;
  int startPos_local;
  Fl_Text_Display *this_local;
  
  retPos._3_1_ = startPosIsLineStart;
  retLines = endPos;
  iStack_24 = startPos;
  _endPos_local = this;
  if (this->mContinuousWrap == 0) {
    pFVar1 = buffer(this);
    this_local._4_4_ = Fl_Text_Buffer::count_lines(pFVar1,iStack_24,retLines);
  }
  else {
    pFVar1 = buffer(this);
    wrapped_line_counter
              (this,pFVar1,iStack_24,retLines,0x7fffffff,(bool)(retPos._3_1_ & 1),0,&retLineEnd,
               &retLineStart,&local_38,&local_3c,true);
    this_local._4_4_ = retLineStart;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Text_Display::count_lines(int startPos, int endPos,
                                 bool startPosIsLineStart) const {
  IS_UTF8_ALIGNED2(buffer(), startPos)
  IS_UTF8_ALIGNED2(buffer(), endPos)

  int retLines, retPos, retLineStart, retLineEnd;

#ifdef DEBUG
  printf("Fl_Text_Display::count_lines(startPos=%d, endPos=%d, startPosIsLineStart=%d\n",
         startPos, endPos, startPosIsLineStart);
#endif // DEBUG

  /* If we're not wrapping use simple (and more efficient) Fl_Text_Buffer::count_lines() */
  if (!mContinuousWrap)
    return buffer()->count_lines(startPos, endPos);

  wrapped_line_counter(buffer(), startPos, endPos, INT_MAX,
                       startPosIsLineStart, 0, &retPos, &retLines, &retLineStart,
                       &retLineEnd);

#ifdef DEBUG
  printf("   # after WLC: retPos=%d, retLines=%d, retLineStart=%d, retLineEnd=%d\n",
         retPos, retLines, retLineStart, retLineEnd);
#endif // DEBUG

  return retLines;
}